

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js.h
# Opt level: O0

string * __thiscall
wasm::ABI::getLegalizationPass_abi_cxx11_
          (string *__return_storage_ptr__,ABI *this,LegalizationLevel level)

{
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  LegalizationLevel level_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"legalize-js-interface",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"legalize-js-interface-minimally",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string getLegalizationPass(LegalizationLevel level) {
  if (level == LegalizationLevel::Full) {
    return "legalize-js-interface";
  } else {
    return "legalize-js-interface-minimally";
  }
}